

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_calculator.cpp
# Opt level: O1

void __thiscall
ON_ArithmeticCalculator::ON_ArithmeticCalculator
          (ON_ArithmeticCalculator *this,ON_ArithmeticCalculator *src)

{
  double *this_00;
  
  this->m_pCalc = (ON_ArithmeticCalculatorImplementation *)0x0;
  if (src->m_pCalc != (ON_ArithmeticCalculatorImplementation *)0x0) {
    this_00 = this->m_inplace_buffer;
    ON_ArithmeticCalculatorImplementation::ON_ArithmeticCalculatorImplementation
              ((ON_ArithmeticCalculatorImplementation *)this_00);
    this->m_pCalc = (ON_ArithmeticCalculatorImplementation *)this_00;
    memcpy(this_00,src->m_pCalc,0x3f0);
    return;
  }
  return;
}

Assistant:

ON_ArithmeticCalculator::ON_ArithmeticCalculator(const ON_ArithmeticCalculator& src)
  : m_pCalc(0)
{
  if ( 0 != src.m_pCalc )
  {
// suppress MSC "conditional expression is constant" warning
#pragma ON_PRAGMA_WARNING_PUSH
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4127 )
    if ( sizeof(*m_pCalc) <= sizeof(m_inplace_buffer) )
    {
      m_pCalc = new ((void*)(&m_inplace_buffer[0])) ON_ArithmeticCalculatorImplementation();
      *m_pCalc = *src.m_pCalc;
    }
#pragma ON_PRAGMA_WARNING_POP
  }
}